

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_cmd.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  intptr_t iVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  Rasterizer *pRVar12;
  uint8_t *__s;
  ulong uVar13;
  long lVar14;
  CmdLine cmd;
  Image image;
  double line [4];
  Point poly [2];
  CmdLine local_100;
  Rasterizer *local_f0;
  Image local_e8;
  double local_c8 [4];
  double local_a8;
  undefined8 uStack_a0;
  char *local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_100.argc = argc;
  local_100.argv = argv;
  bVar8 = CmdLine::hasKey(&local_100,"--help");
  if ((((bVar8) || (bVar8 = CmdLine::hasKey(&local_100,"--width"), !bVar8)) ||
      (bVar8 = CmdLine::hasKey(&local_100,"--height"), !bVar8)) ||
     (bVar8 = CmdLine::hasKey(&local_100,"--output"), !bVar8)) {
    puts("Usage: b2drefras --width=W --height=H --output=file.bmp X Y X Y X Y [...]");
    iVar10 = 1;
  }
  else {
    pcVar11 = CmdLine::valueOf(&local_100,"--width");
    iVar10 = 0;
    iVar9 = 0;
    if (pcVar11 != (char *)0x0) {
      iVar9 = atoi(pcVar11);
    }
    pcVar11 = CmdLine::valueOf(&local_100,"--height");
    if (pcVar11 != (char *)0x0) {
      iVar10 = atoi(pcVar11);
    }
    bVar8 = CmdLine::hasKey(&local_100,"--even-odd");
    local_90 = CmdLine::valueOf(&local_100,"--output");
    local_e8._width = 0;
    local_e8._height = 0;
    local_e8._stride = 0;
    local_e8._data = (uint8_t *)0x0;
    local_a8 = (double)CONCAT44(local_a8._4_4_,iVar10);
    Image::create(&local_e8,iVar9,iVar10);
    iVar7 = local_e8._stride;
    lVar14 = (long)local_e8._width;
    if ((0 < lVar14) && (0 < local_e8._height)) {
      __s = local_e8._data;
      iVar10 = local_e8._height;
      do {
        memset(__s,0,lVar14 << 2);
        __s = __s + iVar7;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    pRVar12 = Rasterizer::newById(&local_e8,1,0);
    pRVar12->_fillMode = (uint)!bVar8;
    iVar10 = 0;
    bVar8 = false;
    if (1 < argc) {
      dVar2 = (double)iVar9;
      dVar3 = (double)local_a8._0_4_;
      uVar13 = 1;
      iVar9 = 0;
      local_f0 = pRVar12;
      do {
        pcVar11 = argv[uVar13];
        if ((*pcVar11 != '-') || (bVar8 = false, pcVar11[1] != '-')) {
          dVar4 = atof(pcVar11);
          lVar14 = (long)iVar9;
          iVar9 = iVar9 + 1;
          local_c8[lVar14] = dVar4;
          if (iVar9 == 2) {
            local_a8 = local_c8[0];
            uStack_a0 = 0;
            local_48 = local_c8[1];
            uStack_40 = 0;
            if ((dVar3 < local_c8[1] || dVar2 < local_c8[0]) ||
                (local_c8[0] < 0.0 || local_c8[1] < 0.0)) {
              puts("Coordinates out of range");
              iVar10 = 1;
              bVar8 = true;
              iVar9 = 2;
              goto LAB_0010262a;
            }
          }
          bVar8 = false;
          if (iVar9 == 4) {
            bVar8 = local_c8[2] < 0.0;
            bVar1 = local_c8[3] < 0.0;
            bVar5 = dVar2 < local_c8[2];
            bVar6 = dVar3 < local_c8[3];
            if ((local_c8[3] <= dVar3 && local_c8[2] <= dVar2) && (!bVar8 && !bVar1)) {
              local_88 = local_c8[0];
              dStack_80 = local_c8[1];
              local_78 = local_c8[2];
              local_70 = local_c8[3];
              local_68 = local_c8[2];
              uStack_60 = 0;
              local_58 = local_c8[3];
              uStack_50 = 0;
              (*local_f0->_vptr_Rasterizer[4])(local_f0,&local_88,2);
              local_c8[0] = local_68;
              local_c8[1] = local_58;
              iVar9 = 2;
            }
            else {
              puts("Coordinates out of range");
              iVar10 = 1;
              iVar9 = 4;
            }
            bVar8 = (bVar6 || bVar5) || (bVar8 || bVar1);
          }
        }
LAB_0010262a:
        if (bVar8) goto LAB_001026f5;
        uVar13 = uVar13 + 1;
      } while ((uint)argc != uVar13);
      bVar8 = 1 < iVar9;
      pRVar12 = local_f0;
    }
    pcVar11 = local_90;
    if (bVar8) {
      local_88 = local_c8[0];
      dStack_80 = local_c8[1];
      local_78 = local_a8;
      local_70 = local_48;
      (*pRVar12->_vptr_Rasterizer[4])(pRVar12,&local_88,2);
    }
    (*pRVar12->_vptr_Rasterizer[5])(pRVar12,0xffffffff);
    (*pRVar12->_vptr_Rasterizer[1])(pRVar12);
    bVar8 = Image::writeBmp(&local_e8,pcVar11);
    iVar10 = 0;
    if (!bVar8) {
      printf("Cannot open file \'%s\' for writing\n",pcVar11);
      iVar10 = 1;
    }
LAB_001026f5:
    if (local_e8._data != (uint8_t *)0x0) {
      free(local_e8._data);
    }
  }
  return iVar10;
}

Assistant:

int main(int argc, char* argv[]) {
  CmdLine cmd(argc, argv);
  int i;

  if (cmd.hasKey("--help") ||
     !cmd.hasKey("--width") ||
     !cmd.hasKey("--height") ||
     !cmd.hasKey("--output")) {
    printf("Usage: b2drefras --width=W --height=H --output=file.bmp X Y X Y X Y [...]\n");
    return 1;
  }

  int w = cmd.intValueOf("--width");
  int h = cmd.intValueOf("--height");
  bool nonZero = !cmd.hasKey("--even-odd");
  const char* fileName = cmd.valueOf("--output");

  uint32_t color = 0xFFFFFFFF;

  Image image;
  image.create(w, h);
  image.fillAll(0);

  // Rasterize the polygon.
  Rasterizer* ras = Rasterizer::newById(image, Rasterizer::kIdA1, 0);
  ras->setFillMode(nonZero ? Rasterizer::kFillNonZero : Rasterizer::kFillEvenOdd);

  double line[4];
  double start[2];
  int index = 0;

  for (i = 1; i < argc; i++) {
    const char* value = argv[i];
    if (value[0] == '-' && value[1] == '-')
      continue;

    // Initial point, required to close the polygon.
    line[index++] = atof(value);
    if (index == 2) {
      double x0 = line[0];
      double y0 = line[1];

      start[0] = x0;
      start[1] = y0;

      if (x0 < 0 || y0 < 0 || x0 > w || y0 > h) {
        printf("Coordinates out of range\n");
        return 1;
      }
    }

    if (index == 4) {
      double x0 = line[0];
      double y0 = line[1];
      double x1 = line[2];
      double y1 = line[3];

      if (x1 < 0 || y1 < 0 || x1 > w || y1 > h) {
        printf("Coordinates out of range\n");
        return 1;
      }

      Point poly[] = { { x0, y0 }, { x1, y1 } };
      ras->addPoly(poly, 2);

      line[0] = x1;
      line[1] = y1;
      index = 2;
    }
  }

  // Close the polygon
  if (index >= 2) {
    double x0 = line[0];
    double y0 = line[1];
    double x1 = start[0];
    double y1 = start[1];

    Point poly[] = { { x0, y0 }, { x1, y1 } };
    ras->addPoly(poly, 2);
  }

  ras->render(color);
  delete ras;

  if (!image.writeBmp(fileName)) {
    printf("Cannot open file '%s' for writing\n", fileName);
    return 1;
  }

  return 0;
}